

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

SquareMatrix<4> * __thiscall
pbrt::SquareMatrix<4>::operator/
          (SquareMatrix<4> *__return_storage_ptr__,SquareMatrix<4> *this,Float s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  SquareMatrix<4> *pSVar8;
  int i;
  long lVar9;
  long lVar10;
  
  uVar1 = *(undefined8 *)(this->m[0] + 2);
  uVar2 = *(undefined8 *)this->m[1];
  uVar3 = *(undefined8 *)(this->m[1] + 2);
  uVar4 = *(undefined8 *)this->m[2];
  uVar5 = *(undefined8 *)(this->m[2] + 2);
  uVar6 = *(undefined8 *)this->m[3];
  uVar7 = *(undefined8 *)(this->m[3] + 2);
  pSVar8 = __return_storage_ptr__;
  *(undefined8 *)__return_storage_ptr__->m[0] = *(undefined8 *)this->m[0];
  *(undefined8 *)(__return_storage_ptr__->m[0] + 2) = uVar1;
  *(undefined8 *)__return_storage_ptr__->m[1] = uVar2;
  *(undefined8 *)(__return_storage_ptr__->m[1] + 2) = uVar3;
  *(undefined8 *)__return_storage_ptr__->m[2] = uVar4;
  *(undefined8 *)(__return_storage_ptr__->m[2] + 2) = uVar5;
  *(undefined8 *)__return_storage_ptr__->m[3] = uVar6;
  *(undefined8 *)(__return_storage_ptr__->m[3] + 2) = uVar7;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      (*(Float (*) [4])*(Float (*) [4])__return_storage_ptr__)[lVar10] =
           (*(Float (*) [4])*(Float (*) [4])__return_storage_ptr__)[lVar10] / s;
    }
    __return_storage_ptr__ = (SquareMatrix<4> *)((long)__return_storage_ptr__ + 0x10);
  }
  return pSVar8;
}

Assistant:

operator/(Float s) const {
        DCHECK_NE(s, 0);
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] /= s;
        return r;
    }